

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _d,int _c,Allocator *_allocator)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  Allocator *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar2;
  Allocator *unaff_retaddr;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  size_t in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffe20;
  Mat *pMVar3;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  int *local_1b0;
  long *local_198;
  int local_15c;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  
  if (*(int *)((long)&in_RSI[5]._vptr_Allocator + 4) * *(int *)&in_RSI[6]._vptr_Allocator *
      *(int *)((long)&in_RSI[6]._vptr_Allocator + 4) * *(int *)&in_RSI[7]._vptr_Allocator ==
      in_EDX * in_ECX * in_R8D * in_R9D) {
    if (*(int *)&in_RSI[5]._vptr_Allocator < 3) {
      if ((long)in_EDX * (long)in_ECX * (long)in_R8D !=
          ((long)in_EDX * (long)in_ECX * (long)in_R8D * (long)in_RSI[2]._vptr_Allocator + 0xfU &
          0xfffffffffffffff0) / (ulong)in_RSI[2]._vptr_Allocator) {
        in_RDI->data = (void *)0x0;
        in_RDI->refcount = (int *)0x0;
        in_RDI->elemsize = 0;
        in_RDI->elempack = 0;
        in_RDI->allocator = (Allocator *)0x0;
        in_RDI->dims = 0;
        in_RDI->w = 0;
        in_RDI->h = 0;
        in_RDI->d = 0;
        in_RDI->c = 0;
        in_RDI->cstep = 0;
        pMVar3 = in_RDI;
        create(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
               (int)in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
               (int)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffe20,
               (Allocator *)in_RDI);
        bVar2 = true;
        if (pMVar3->data != (void *)0x0) {
          bVar2 = pMVar3->cstep * (long)pMVar3->c == 0;
        }
        if (bVar2) {
          return in_RDI;
        }
        for (local_15c = 0; local_15c < in_R9D; local_15c = local_15c + 1) {
          memcpy((void *)((long)pMVar3->data + (long)local_15c * pMVar3->cstep * pMVar3->elemsize),
                 (_func_int **)
                 ((long)in_RSI->_vptr_Allocator +
                 (long)local_15c * (long)in_EDX * (long)in_ECX * (long)in_R8D *
                 (long)in_RSI[2]._vptr_Allocator),
                 (long)in_EDX * (long)in_ECX * (long)in_R8D * (long)in_RSI[2]._vptr_Allocator);
        }
        return in_RDI;
      }
    }
    else if (*(int *)&in_RSI[7]._vptr_Allocator != in_R9D) {
      reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_RSI);
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,in_stack_fffffffffffffebc,
              in_stack_fffffffffffffeb8,unaff_retaddr);
      if (local_1b0 == (int *)0x0) {
        return in_RDI;
      }
      LOCK();
      iVar1 = *local_1b0;
      *local_1b0 = *local_1b0 + -1;
      UNLOCK();
      if (iVar1 != 1) {
        return in_RDI;
      }
      if (local_198 != (long *)0x0) {
        (**(code **)(*local_198 + 0x18))(local_198,in_stack_fffffffffffffe48);
        return in_RDI;
      }
      if (in_stack_fffffffffffffe48 == (Mat *)0x0) {
        return in_RDI;
      }
      free(in_stack_fffffffffffffe48);
      return in_RDI;
    }
    in_RDI->data = in_RSI->_vptr_Allocator;
    in_RDI->refcount = (int *)in_RSI[1]._vptr_Allocator;
    in_RDI->elemsize = (size_t)in_RSI[2]._vptr_Allocator;
    in_RDI->elempack = *(int *)&in_RSI[3]._vptr_Allocator;
    in_RDI->allocator = (Allocator *)in_RSI[4]._vptr_Allocator;
    in_RDI->dims = *(int *)&in_RSI[5]._vptr_Allocator;
    in_RDI->w = *(int *)((long)&in_RSI[5]._vptr_Allocator + 4);
    in_RDI->h = *(int *)&in_RSI[6]._vptr_Allocator;
    in_RDI->d = *(int *)((long)&in_RSI[6]._vptr_Allocator + 4);
    in_RDI->c = *(int *)&in_RSI[7]._vptr_Allocator;
    in_RDI->cstep = (size_t)in_RSI[8]._vptr_Allocator;
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
    in_RDI->dims = 4;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->d = in_R8D;
    in_RDI->c = in_R9D;
    in_RDI->cstep =
         ((long)in_EDX * (long)in_ECX * (long)in_R8D * (long)in_RSI[2]._vptr_Allocator + 0xfU &
         0xfffffffffffffff0) / (ulong)in_RSI[2]._vptr_Allocator;
  }
  else {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _d, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _d * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h * _d != alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _d, _c, elemsize, elempack, _allocator);
            if (m.empty())
                return m;

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * _d * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * _d * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _d * _c, _allocator);
        return tmp.reshape(_w, _h, _d, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 4;
    m.w = _w;
    m.h = _h;
    m.d = _d;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize;

    return m;
}